

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.h
# Opt level: O0

CRuleSet * allocator_default<CDoodadsMapper::CRuleSet>::alloc_array(int size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  CRuleSet *pCVar5;
  int in_EDI;
  ulong uVar6;
  CRuleSet *local_40;
  
  uVar2 = (ulong)in_EDI;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x90),0);
  uVar6 = uVar3 + 8;
  if (SUB168(auVar1 * ZEXT816(0x90),8) != 0 || 0xfffffffffffffff7 < uVar3) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar4 = (ulong *)operator_new__(uVar6);
  *puVar4 = uVar2;
  pCVar5 = (CRuleSet *)(puVar4 + 1);
  if (uVar2 != 0) {
    local_40 = pCVar5;
    do {
      CDoodadsMapper::CRuleSet::CRuleSet((CRuleSet *)0x1e6eb4);
      local_40 = local_40 + 1;
    } while (local_40 != pCVar5 + uVar2);
  }
  return pCVar5;
}

Assistant:

static T *alloc_array(int size) { return new T [size]; }